

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O2

void __thiscall TTD::MarkTable::InitializeIter(MarkTable *this)

{
  this->m_iterPos = 0;
  if (*this->m_markArray != Clear) {
    return;
  }
  MoveToNextAddress(this);
  return;
}

Assistant:

void InitializeIter()
        {
            this->m_iterPos = 0;

            if (this->m_markArray[0] == MarkTableTag::Clear)
            {
                this->MoveToNextAddress();
            }
        }